

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::convert_double_to_string_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t col,
          uint32_t row)

{
  pointer pcVar1;
  bool bVar2;
  string sVar3;
  char cVar4;
  uint uVar5;
  uint64_t uVar6;
  size_t sVar7;
  runtime_error *prVar8;
  string *psVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  char *comment;
  char print_buffer [64];
  char buf [64];
  char (*in_stack_fffffffffffffc60) [5];
  char *local_388;
  double local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  string local_358 [2];
  undefined1 *local_318 [2];
  undefined1 local_308 [16];
  undefined1 local_2f8;
  string asStack_2f7 [7];
  undefined4 local_2f0;
  undefined8 local_2ec;
  undefined4 local_2e4;
  undefined4 local_2e0;
  undefined1 *local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined1 local_2c0 [32];
  undefined1 *local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined1 local_288 [8];
  undefined4 local_280;
  undefined2 local_27c;
  undefined4 local_278;
  undefined1 *local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined1 local_258 [32];
  undefined1 *local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined8 local_1e8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1e0;
  string local_1a0;
  undefined **local_180;
  undefined4 local_178;
  undefined4 local_174;
  undefined *local_170;
  undefined4 local_168;
  undefined1 *local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined1 local_148 [32];
  undefined1 *local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined1 local_110 [8];
  undefined4 local_108;
  undefined2 local_104;
  undefined4 local_100;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined1 auStack_e0 [32];
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 auStack_a8 [32];
  undefined4 local_88;
  undefined8 local_70;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_380 = (c->m).c[col].r[row].f64;
  if ((!NAN(local_380) && !NAN(local_380)) && ABS(local_380) != INFINITY) {
    sVar3 = (string)this->current_locale_radix_character;
    sprintf(&local_2f8,"%.32g");
    if (local_2f8 != (string)0x0 && sVar3 != (string)0x2e) {
      psVar9 = asStack_2f7;
      do {
        if (local_2f8 == sVar3) {
          psVar9[-1] = (string)0x2e;
        }
        local_2f8 = *psVar9;
        psVar9 = psVar9 + 1;
      } while (local_2f8 != (string)0x0);
    }
    pcVar11 = strchr(&local_2f8,0x2e);
    if ((pcVar11 == (char *)0x0) && (pcVar11 = strchr(&local_2f8,0x65), pcVar11 == (char *)0x0)) {
      sVar7 = strlen(&local_2f8);
      *(undefined2 *)(&local_2f8 + sVar7) = 0x302e;
      asStack_2f7[sVar7 + 1] = (string)0x0;
    }
    local_180 = &local_170;
    sVar7 = strlen(&local_2f8);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,&local_2f8,&local_2f8 + sVar7);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180);
    }
    if ((this->backend).double_literal_suffix != true) {
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  bVar2 = (this->options).es;
  uVar5 = (this->options).version;
  uVar12 = 0x81;
  if (bVar2 != false) {
    uVar12 = 299;
  }
  if (uVar12 < uVar5) {
    local_2d8 = local_2c0;
    local_2f0 = 0;
    _local_2f8 = &PTR__SPIRType_003d5290;
    local_2e0 = 1;
    local_2d0 = 0;
    local_2c8 = 8;
    local_2a0 = local_288;
    local_298 = 0;
    local_290 = 8;
    local_280 = 0;
    local_27c = 0;
    local_278 = 8;
    local_360 = local_258;
    local_268 = 0;
    local_260 = 8;
    local_368 = local_220;
    local_230 = 0;
    local_228 = 8;
    local_200 = 0;
    local_1e8 = 0;
    local_1e0._M_buckets = &local_1e0._M_single_bucket;
    local_160 = local_148;
    local_178 = 0;
    local_180 = &PTR__SPIRType_003d5290;
    local_168 = 1;
    local_158 = 0;
    local_150 = 8;
    local_120 = 0;
    local_118 = 8;
    local_108 = 0;
    local_104 = 0;
    local_100 = 8;
    local_370 = auStack_e0;
    local_f0 = 0;
    local_e8 = 8;
    local_378 = auStack_a8;
    local_b8 = 0;
    local_b0 = 8;
    local_88 = 0;
    local_70 = 0;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_1e0._M_bucket_count = 1;
    local_1e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1e0._M_element_count = 0;
    local_68._M_bucket_count = 1;
    local_1e0._M_rehash_policy._M_max_load_factor = 1.0;
    local_1e0._M_rehash_policy._M_next_resize = 0;
    local_1e0._M_single_bucket = (__node_base_ptr)0x0;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_2ec = 0x400000000e;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_174 = 10;
    local_2e4 = 1;
    local_170 = (undefined *)0x100000040;
    local_270 = local_360;
    local_238 = local_368;
    local_128 = local_110;
    local_f8 = local_370;
    local_c0 = local_378;
    if (uVar5 < 0x136 && bVar2 == true) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_358[0]._M_dataplus._M_p = (pointer)&local_358[0].field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_358,
                 "64-bit integers not supported in ES profile before version 310.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)local_358);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar6 = (c->m).c[col].r[row].u64;
    local_358[0]._M_dataplus._M_p = (pointer)&local_358[0].field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"GL_ARB_gpu_shader_int64","");
    require_extension_internal(this,local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358[0]._M_dataplus._M_p != &local_358[0].field_2) {
      operator_delete(local_358[0]._M_dataplus._M_p);
    }
    pcVar11 = "ul";
    if ((this->backend).long_long_literal_suffix != false) {
      pcVar11 = "ull";
    }
    snprintf((char *)local_358,0x40,"0x%llx%s",uVar6,pcVar11);
    local_388 = "inf";
    if (-INFINITY < local_380) {
      if (NAN(local_380)) {
        local_388 = "nan";
      }
    }
    else {
      local_388 = "-inf";
    }
    (*(this->super_Compiler)._vptr_Compiler[0x38])(local_318,this,&local_2f8,&local_180);
    join<std::__cxx11::string,char_const(&)[2],char(&)[64],char_const(&)[5],char_const*&,char_const(&)[5]>
              (&local_1a0,(spirv_cross *)local_318,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35c56f,
               (char (*) [2])local_358,(char (*) [64])" /* ",(char (*) [5])&local_388,
               (char **)" */)",in_stack_fffffffffffffc60);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    if (local_318[0] != local_308) {
      operator_delete(local_318[0]);
    }
    local_180 = &PTR__SPIRType_003d5290;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != local_378) {
      free(local_c0);
    }
    local_f0 = 0;
    if (local_f8 != local_370) {
      free(local_f8);
    }
    local_120 = 0;
    if (local_128 != local_110) {
      free(local_128);
    }
    local_158 = 0;
    if (local_160 != local_148) {
      free(local_160);
    }
    _local_2f8 = &PTR__SPIRType_003d5290;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_1e0);
    local_230 = 0;
    if (local_238 != local_368) {
      free(local_238);
    }
    local_268 = 0;
    if (local_270 != local_360) {
      free(local_270);
    }
    local_298 = 0;
    if (local_2a0 != local_288) {
      free(local_2a0);
    }
    local_2d0 = 0;
    if (local_2d8 == local_2c0) {
      return __return_storage_ptr__;
    }
    free(local_2d8);
    return __return_storage_ptr__;
  }
  if (bVar2 != false) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    _local_2f8 = (undefined **)((long)&local_2ec + 4);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2f8,"FP64 not supported in ES profile.","");
    ::std::runtime_error::runtime_error(prVar8,(string *)&local_2f8);
    *(undefined ***)prVar8 = &PTR__runtime_error_003d4e98;
    __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  pcVar1 = (pointer)((long)&local_2ec + 4);
  _local_2f8 = (undefined **)pcVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f8,"GL_ARB_gpu_shader_fp64","");
  require_extension_internal(this,(string *)&local_2f8);
  if (_local_2f8 != (undefined **)pcVar1) {
    operator_delete(_local_2f8);
  }
  if (local_380 < INFINITY) {
    if (local_380 <= -INFINITY) {
      pcVar11 = "(-1.0 / 0.0)";
      if ((this->backend).double_literal_suffix != false) {
        pcVar11 = "(-1.0lf / 0.0lf)";
      }
      goto LAB_001eb7c5;
    }
    if (!NAN(local_380)) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      _local_2f8 = (undefined **)pcVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f8,"Cannot represent non-finite floating point constant.","");
      ::std::runtime_error::runtime_error(prVar8,(string *)&local_2f8);
      *(undefined ***)prVar8 = &PTR__runtime_error_003d4e98;
      __cxa_throw(prVar8,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    cVar4 = (this->backend).double_literal_suffix;
    pcVar10 = "(0.0lf / 0.0lf)";
    pcVar11 = "(0.0 / 0.0)";
  }
  else {
    cVar4 = (this->backend).double_literal_suffix;
    pcVar10 = "(1.0lf / 0.0lf)";
    pcVar11 = "(1.0 / 0.0)";
  }
  if (cVar4 != '\0') {
    pcVar11 = pcVar10;
  }
LAB_001eb7c5:
  ::std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar11);
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::convert_double_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	double double_value = c.scalar_f64(col, row);

	if (std::isnan(double_value) || std::isinf(double_value))
	{
		// Use special representation.
		if (!is_legacy())
		{
			SPIRType out_type;
			SPIRType in_type;
			out_type.basetype = SPIRType::Double;
			in_type.basetype = SPIRType::UInt64;
			out_type.vecsize = 1;
			in_type.vecsize = 1;
			out_type.width = 64;
			in_type.width = 64;

			uint64_t u64_value = c.scalar_u64(col, row);

			if (options.es && options.version < 310) // GL_NV_gpu_shader5 fallback requires 310.
				SPIRV_CROSS_THROW("64-bit integers not supported in ES profile before version 310.");
			require_extension_internal("GL_ARB_gpu_shader_int64");

			char print_buffer[64];
#ifdef _WIN32
			sprintf(print_buffer, "0x%llx%s", static_cast<unsigned long long>(u64_value),
			        backend.long_long_literal_suffix ? "ull" : "ul");
#else
			snprintf(print_buffer, sizeof(print_buffer), "0x%llx%s", static_cast<unsigned long long>(u64_value),
			         backend.long_long_literal_suffix ? "ull" : "ul");
#endif

			const char *comment = "inf";
			if (double_value == -numeric_limits<double>::infinity())
				comment = "-inf";
			else if (std::isnan(double_value))
				comment = "nan";
			res = join(bitcast_glsl_op(out_type, in_type), "(", print_buffer, " /* ", comment, " */)");
		}
		else
		{
			if (options.es)
				SPIRV_CROSS_THROW("FP64 not supported in ES profile.");
			if (options.version < 400)
				require_extension_internal("GL_ARB_gpu_shader_fp64");

			if (double_value == numeric_limits<double>::infinity())
			{
				if (backend.double_literal_suffix)
					res = "(1.0lf / 0.0lf)";
				else
					res = "(1.0 / 0.0)";
			}
			else if (double_value == -numeric_limits<double>::infinity())
			{
				if (backend.double_literal_suffix)
					res = "(-1.0lf / 0.0lf)";
				else
					res = "(-1.0 / 0.0)";
			}
			else if (std::isnan(double_value))
			{
				if (backend.double_literal_suffix)
					res = "(0.0lf / 0.0lf)";
				else
					res = "(0.0 / 0.0)";
			}
			else
				SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
		}
	}
	else
	{
		res = convert_to_string(double_value, current_locale_radix_character);
		if (backend.double_literal_suffix)
			res += "lf";
	}

	return res;
}